

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

size_t phf_primeup(size_t n)

{
  bool bVar1;
  undefined1 local_19;
  undefined8 local_18;
  size_t n_local;
  
  local_18 = n;
  if (n < 0xfffffffc) {
    while( true ) {
      local_19 = 0;
      if (local_18 != 0xffffffffffffffff) {
        bVar1 = phf_isprime(local_18);
        local_19 = bVar1 ^ 0xff;
      }
      if ((local_19 & 1) == 0) break;
      local_18 = local_18 + 1;
    }
    n_local = local_18;
  }
  else {
    n_local = 0;
  }
  return n_local;
}

Assistant:

static inline size_t phf_primeup(size_t n) {
	/* NB: 4294967291 is largest 32-bit prime */
	if (n > 4294967291)
		return 0;

	while (n < SIZE_MAX && !phf_isprime(n))
		n++;

	return n;
}